

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryHelpers.hpp
# Opt level: O0

string * generateStringVector_if<gmlc::libguarded::shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,helics::InterfaceHandle,(reference_stability)0,5>,std::mutex>,helics::ValueFederateManager::localQuery[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)const::__5,helics::ValueFederateManager::localQuery[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)const::__6>
                   (string *param_1,undefined8 param_2)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  Input *ele;
  const_iterator __end0;
  const_iterator __begin0;
  shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  *__range1;
  string *ret;
  Input *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  string *this;
  string *in_stack_ffffffffffffff58;
  allocator<char> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> local_68;
  BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> local_50;
  undefined8 local_38;
  allocator<char> local_1a;
  undefined1 local_19;
  undefined8 local_18;
  string *local_8;
  
  local_19 = 0;
  this = param_1;
  local_18 = param_2;
  local_8 = param_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::allocator<char>::~allocator(&local_1a);
  local_38 = local_18;
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::begin((shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
           *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::end((shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
         *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  while (bVar1 = gmlc::containers::
                 BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*>::operator!=
                           (&local_50,&local_68), bVar1) {
    gmlc::containers::BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*>::
    operator*(&local_50);
    in_stack_ffffffffffffff37 =
         const::$_6::operator()
                   ((anon_class_1_0_00000001 *)
                    CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                    in_stack_ffffffffffffff28);
    if ((bool)in_stack_ffffffffffffff37) {
      const::$_5::operator()
                ((anon_class_1_0_00000001 *)param_1,
                 (Input *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
      helics::generateJsonQuotedString(in_stack_ffffffffffffff58);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (this,param_1);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(this,(char)((ulong)param_1 >> 0x38));
    }
    gmlc::containers::BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*>::
    operator++((BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> *)
               CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  }
  sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (this);
  if (sVar2 < 2) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (this,(char)((ulong)param_1 >> 0x38));
  }
  else {
    pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    *pvVar3 = ']';
  }
  return param_1;
}

Assistant:

std::string generateStringVector_if(const X& data, Proc generator, validator valid)
{
    static_assert(std::is_convertible<decltype(generator(*(data.begin()))), std::string>::value,
                  "generator output must be convertible to std::string");
    std::string ret{"["};
    for (auto& ele : data) {
        if (valid(ele)) {
            ret.append(helics::generateJsonQuotedString(generator(ele)));
            ret.push_back(',');
        }
    }
    if (ret.size() > 1) {
        ret.back() = ']';
    } else {
        ret.push_back(']');
    }
    return ret;
}